

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrAddColumn(Llb_Mtr_t *p,Llb_Grp_t *pGrp)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int iCol;
  int iRow;
  int i;
  Aig_Obj_t *pVar;
  Llb_Grp_t *pGrp_local;
  Llb_Mtr_t *p_local;
  
  iVar1 = pGrp->Id;
  if ((-1 < iVar1) && (iVar1 < p->nCols)) {
    p->pColGrps[iVar1] = pGrp;
    iCol = 0;
    while( true ) {
      iVar3 = Vec_PtrSize(pGrp->vIns);
      if (iVar3 <= iCol) {
        iCol = 0;
        while( true ) {
          iVar3 = Vec_PtrSize(pGrp->vOuts);
          if (iVar3 <= iCol) {
            return;
          }
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pGrp->vOuts,iCol);
          pVVar2 = pGrp->pMan->vObj2Var;
          iVar3 = Aig_ObjId(pAVar4);
          iVar3 = Vec_IntEntry(pVVar2,iVar3);
          if ((iVar3 < 0) || (p->nRows <= iVar3)) break;
          p->pMatrix[iVar1][iVar3] = '\x01';
          p->pColSums[iVar1] = p->pColSums[iVar1] + 1;
          p->pRowSums[iVar3] = p->pRowSums[iVar3] + 1;
          iCol = iCol + 1;
        }
        __assert_fail("iRow >= 0 && iRow < p->nRows",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                      ,0x16b,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
      }
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pGrp->vIns,iCol);
      pVVar2 = pGrp->pMan->vObj2Var;
      iVar3 = Aig_ObjId(pAVar4);
      iVar3 = Vec_IntEntry(pVVar2,iVar3);
      if ((iVar3 < 0) || (p->nRows <= iVar3)) break;
      p->pMatrix[iVar1][iVar3] = '\x01';
      p->pColSums[iVar1] = p->pColSums[iVar1] + 1;
      p->pRowSums[iVar3] = p->pRowSums[iVar3] + 1;
      iCol = iCol + 1;
    }
    __assert_fail("iRow >= 0 && iRow < p->nRows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                  ,0x163,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
  }
  __assert_fail("iCol >= 0 && iCol < p->nCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                ,0x15e,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
}

Assistant:

void Llb_MtrAddColumn( Llb_Mtr_t * p, Llb_Grp_t * pGrp )
{
    Aig_Obj_t * pVar;
    int i, iRow, iCol = pGrp->Id;
    assert( iCol >= 0 && iCol < p->nCols );
    p->pColGrps[iCol] = pGrp;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vIns, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vOuts, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
}